

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CERunningDate.cpp
# Opt level: O1

CERunningDate * __thiscall CERunningDate::operator=(CERunningDate *this,CERunningDate *other)

{
  if (this != other) {
    CEDate::operator=(&this->super_CEDate,&other->super_CEDate);
    init_members(this);
    copy_members(this,other);
  }
  return this;
}

Assistant:

CERunningDate& CERunningDate::operator=(const CERunningDate& other)
{
    if (this != &other) {
        this->CEDate::operator=(other);
        free_members();
        init_members();
        copy_members(other);
    }
    return *this;
}